

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  undefined8 *puVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumnsSet *pIVar4;
  ImGuiColumnsSet *pIVar5;
  ImGuiColumnData *pIVar6;
  undefined8 uVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ImU32 col;
  ImGuiContext *g_1;
  float *pfVar12;
  ulong uVar13;
  ImGuiWindow *window;
  long lVar14;
  ImGuiContext *g;
  ImGuiID id;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  bool held;
  bool hovered;
  ImRect column_rect;
  float y2;
  bool local_aa;
  bool local_a9;
  ulong local_a8;
  float local_9c;
  ImVec4 local_98;
  ImVec2 local_88;
  ImRect local_80;
  ImGuiContext *local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar8 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).ColumnsSet;
  iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  iVar10 = iVar11 + -1;
  (pIVar3->DC).ItemWidthStack.Size = iVar10;
  if (iVar10 == 0) {
    pfVar12 = &pIVar3->ItemWidthDefault;
  }
  else {
    pfVar12 = (pIVar3->DC).ItemWidthStack.Data + (long)iVar11 + -2;
  }
  (pIVar3->DC).ItemWidth = *pfVar12;
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar3->DrawList);
  fVar18 = (pIVar3->DC).CursorPos.y;
  uVar15 = -(uint)(fVar18 <= pIVar4->LineMaxY);
  local_68 = (float)(~uVar15 & (uint)fVar18 | (uint)pIVar4->LineMaxY & uVar15);
  pIVar4->LineMaxY = local_68;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  (pIVar3->DC).CursorPos.y = local_68;
  uVar15 = pIVar4->Flags;
  if ((uVar15 & 0x10) == 0) {
    (pIVar3->DC).CursorMaxPos.x = pIVar4->StartMaxPosX;
  }
  if (((uVar15 & 1) == 0) && (pIVar3->SkipItems == false)) {
    uVar15 = pIVar4->Count;
    iVar11 = -1;
    if (1 < (int)uVar15) {
      local_70 = pIVar8;
      local_9c = pIVar4->StartPosY;
      local_58 = ZEXT416((uint)(local_9c + 1.0));
      local_a8 = 0xffffffff;
      uVar13 = 1;
      lVar14 = 0;
      do {
        pIVar8 = GImGui;
        pIVar5 = (GImGui->CurrentWindow->DC).ColumnsSet;
        local_80.Max.x =
             (pIVar5->MaxX - pIVar5->MinX) *
             *(float *)((long)&(pIVar5->Columns).Data[1].OffsetNorm + lVar14) + pIVar5->MinX +
             (pIVar3->Pos).x;
        id = pIVar4->ID + (int)uVar13;
        local_80.Min.x = local_80.Max.x + -4.0;
        local_48 = ZEXT416((uint)local_80.Max.x);
        local_80.Max.x = local_80.Max.x + 4.0;
        local_80.Min.y = local_9c;
        local_80.Max.y = local_68;
        if (id == GImGui->ActiveId) {
          GImGui->ActiveIdIsAlive = id;
        }
        if (id == pIVar8->ActiveIdPreviousFrame) {
          pIVar8->ActiveIdPreviousFrameIsAlive = true;
        }
        bVar9 = IsClippedEx(&local_80,id,false);
        if (!bVar9) {
          local_a9 = false;
          local_aa = false;
          if ((pIVar4->Flags & 2) == 0) {
            ButtonBehavior(&local_80,id,&local_a9,&local_aa,0);
            if ((local_a9 != false) || (local_aa == true)) {
              local_70->MouseCursor = 4;
            }
            if (local_aa == true) {
              if ((*(byte *)((long)&(pIVar4->Columns).Data[1].Flags + lVar14) & 2) == 0) {
                local_a8 = uVar13;
              }
              local_a8 = local_a8 & 0xffffffff;
            }
          }
          iVar11 = (local_a9 & 1) + 0x1b;
          if (local_aa != false) {
            iVar11 = 0x1d;
          }
          puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar11 << 4));
          local_98._0_8_ = *puVar1;
          uVar7 = puVar1[1];
          local_98.w = (float)((ulong)uVar7 >> 0x20);
          local_98.z = (float)uVar7;
          local_98.w = (GImGui->Style).Alpha * local_98.w;
          col = ColorConvertFloat4ToU32(&local_98);
          local_88.x = (float)(int)(float)local_48._0_4_;
          fVar18 = (pIVar3->ClipRect).Min.y;
          uVar15 = -(uint)(fVar18 <= (float)local_58._0_4_);
          local_98.y = (float)(~uVar15 & (uint)fVar18 | uVar15 & local_58._0_4_);
          local_98.x = local_88.x;
          fVar18 = (pIVar3->ClipRect).Max.y;
          local_88.y = local_68;
          if (fVar18 <= local_68) {
            local_88.y = fVar18;
          }
          ImDrawList::AddLine(pIVar3->DrawList,(ImVec2 *)&local_98,&local_88,col,1.0);
        }
        uVar13 = uVar13 + 1;
        uVar15 = pIVar4->Count;
        lVar14 = lVar14 + 0x1c;
      } while ((long)uVar13 < (long)(int)uVar15);
      iVar11 = (int)local_a8;
    }
    if (iVar11 != -1) {
      if ((-1 < (int)uVar15) && (pIVar4->IsBeingResized == false)) {
        pIVar6 = (pIVar4->Columns).Data;
        lVar14 = 0;
        do {
          *(undefined4 *)((long)&pIVar6->OffsetNormBeforeResize + lVar14) =
               *(undefined4 *)((long)&pIVar6->OffsetNorm + lVar14);
          lVar14 = lVar14 + 0x1c;
        } while ((ulong)uVar15 * 0x1c + 0x1c != lVar14);
      }
      pIVar4->IsBeingResized = true;
      fVar18 = (((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar5 = (GImGui->CurrentWindow->DC).ColumnsSet;
      if (iVar11 < 1) {
        iVar10 = pIVar5->Current;
      }
      else {
        iVar10 = iVar11 + -1;
      }
      pIVar6 = (pIVar5->Columns).Data;
      fVar2 = pIVar5->MinX;
      fVar16 = pIVar5->MaxX - fVar2;
      fVar17 = (GImGui->Style).ColumnsMinSpacing;
      fVar19 = pIVar6[iVar10].OffsetNorm * fVar16 + fVar2 + fVar17;
      uVar15 = -(uint)(fVar19 <= fVar18);
      fVar18 = (float)(uVar15 & (uint)fVar18 | ~uVar15 & (uint)fVar19);
      if ((pIVar4->Flags & 4) != 0) {
        if (iVar11 < -1) {
          iVar10 = pIVar5->Current;
        }
        else {
          iVar10 = iVar11 + 1;
        }
        fVar17 = (fVar16 * pIVar6[iVar10].OffsetNorm + fVar2) - fVar17;
        if (fVar17 <= fVar18) {
          fVar18 = fVar17;
        }
      }
      SetColumnOffset(iVar11,fVar18);
    }
    bVar9 = iVar11 != -1;
  }
  else {
    bVar9 = false;
  }
  pIVar4->IsBeingResized = bVar9;
  (pIVar3->DC).ColumnsSet = (ImGuiColumnsSet *)0x0;
  (pIVar3->DC).ColumnsOffset.x = 0.0;
  (pIVar3->DC).CursorPos.x = (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->StartMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = columns->StartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hw = GetColumnsRectHalfWidth(); // Half-width for interaction
            const ImRect column_rect(ImVec2(x - column_hw, y1), ImVec2(x + column_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(columns->Columns[n].Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column (we clip the Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.)
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, ImMax(y1 + 1.0f, window->ClipRect.Min.y)), ImVec2(xi, ImMin(y2, window->ClipRect.Max.y)), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.ColumnsSet = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}